

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

void uiter_setCharacterIterator_63(UCharIterator *iter,CharacterIterator *charIter)

{
  long lVar1;
  UCharIterator *pUVar2;
  UCharIterator *pUVar3;
  
  if (iter != (UCharIterator *)0x0) {
    if (charIter != (CharacterIterator *)0x0) {
      pUVar2 = &characterIteratorWrapper;
      pUVar3 = iter;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        pUVar3->context = pUVar2->context;
        pUVar2 = (UCharIterator *)&pUVar2->length;
        pUVar3 = (UCharIterator *)&pUVar3->length;
      }
      iter->context = charIter;
      return;
    }
    pUVar2 = &noopIterator;
    for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
      iter->context = pUVar2->context;
      pUVar2 = (UCharIterator *)&pUVar2->length;
      iter = (UCharIterator *)&iter->length;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setCharacterIterator(UCharIterator *iter, CharacterIterator *charIter) {
    if(iter!=0) {
        if(charIter!=0) {
            *iter=characterIteratorWrapper;
            iter->context=charIter;
        } else {
            *iter=noopIterator;
        }
    }
}